

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuConfig.cpp
# Opt level: O3

void __thiscall xmrig::CpuConfig::generate(CpuConfig *this)

{
  uint uVar1;
  const_iterator cVar2;
  ICpuInfo *pIVar3;
  size_t sVar4;
  void *local_48 [2];
  pointer local_38;
  
  if (this->m_enabled == true) {
    String::String((String *)local_48,"cn/blur");
    cVar2 = std::
            _Rb_tree<xmrig::String,_std::pair<const_xmrig::String,_xmrig::CpuThreads>,_std::_Select1st<std::pair<const_xmrig::String,_xmrig::CpuThreads>_>,_std::less<xmrig::String>,_std::allocator<std::pair<const_xmrig::String,_xmrig::CpuThreads>_>_>
            ::find((_Rb_tree<xmrig::String,_std::pair<const_xmrig::String,_xmrig::CpuThreads>,_std::_Select1st<std::pair<const_xmrig::String,_xmrig::CpuThreads>_>,_std::less<xmrig::String>,_std::allocator<std::pair<const_xmrig::String,_xmrig::CpuThreads>_>_>
                    *)&this->m_threads,(key_type *)local_48);
    if ((char *)local_48[0] != (char *)0x0) {
      operator_delete__(local_48[0]);
    }
    if ((_Rb_tree_header *)cVar2._M_node ==
        &(this->m_threads).m_profiles._M_t._M_impl.super__Rb_tree_header) {
      uVar1 = this->m_limit;
      pIVar3 = Cpu::info();
      (*pIVar3->_vptr_ICpuInfo[7])(local_48,pIVar3,(ulong)uVar1);
      sVar4 = Threads<xmrig::CpuThreads>::move(&this->m_threads,"cn/blur",(CpuThreads *)local_48);
      if (local_38 != (pointer)0x0) {
        operator_delete(local_38);
      }
      this->m_shouldSave = sVar4 != 0;
    }
  }
  return;
}

Assistant:

void xmrig::CpuConfig::generate()
{
    if (!isEnabled() || m_threads.has()) {
        return;
    }

    size_t count = 0;

    count += xmrig::generate(m_threads, m_limit);
    m_shouldSave = count > 0;
}